

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O0

double GetLiteralCost(CostModel *m,uint32_t v)

{
  uint32_t v_local;
  CostModel *m_local;
  
  return m->alpha_[v >> 0x18] + m->red_[v >> 0x10 & 0xff] + m->literal_[v >> 8 & 0xff] +
         m->blue_[v & 0xff];
}

Assistant:

static WEBP_INLINE double GetLiteralCost(const CostModel* const m, uint32_t v) {
  return m->alpha_[v >> 24] +
         m->red_[(v >> 16) & 0xff] +
         m->literal_[(v >> 8) & 0xff] +
         m->blue_[v & 0xff];
}